

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmExportInstallFileGenerator::FindNamespaces
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  cmExportSet *this_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
  *this_01;
  reference ppVar4;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_02;
  reference ppcVar5;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *this_03;
  reference ppcVar6;
  string *__x;
  cmInstallExportGenerator *install;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *__range3;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *installs;
  cmTargetExport *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range2;
  bool containsTarget;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *targets;
  cmExportSet *exportSet;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
  *expIt;
  const_iterator __end1;
  const_iterator __begin1;
  cmExportSetMap *__range1;
  cmExportSetMap *exportSets;
  string *name_local;
  cmGlobalGenerator *gg_local;
  cmExportInstallFileGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *namespaces;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_01 = &cmGlobalGenerator::GetExportSets(gg)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
  ;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
           ::begin(this_01);
  expIt = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
             ::end(this_01);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&expIt);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>
             ::operator*(&__end1);
    this_00 = ppVar4->second;
    this_02 = cmExportSet::GetTargetExports(this_00);
    bVar1 = false;
    __end2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_02);
    target = (cmTargetExport *)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                       *)&target), bVar2) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                ::operator*(&__end2);
      _Var3 = std::operator==(name,&(*ppcVar5)->TargetName);
      if (_Var3) {
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      this_03 = cmExportSet::GetInstallations(this_00);
      __end3 = std::
               vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
               ::begin(this_03);
      install = (cmInstallExportGenerator *)
                std::
                vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                ::end(this_03);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                                         *)&install), bVar1) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                  ::operator*(&__end3);
        __x = cmInstallExportGenerator::GetNamespace_abi_cxx11_(*ppcVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,__x);
        __gnu_cxx::
        __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::vector<std::string> cmExportInstallFileGenerator::FindNamespaces(
  cmGlobalGenerator* gg, const std::string& name)
{
  std::vector<std::string> namespaces;
  const cmExportSetMap& exportSets = gg->GetExportSets();

  for (auto const& expIt : exportSets) {
    const cmExportSet* exportSet = expIt.second;
    std::vector<cmTargetExport*> const* targets =
      exportSet->GetTargetExports();

    bool containsTarget = false;
    for (cmTargetExport* target : *targets) {
      if (name == target->TargetName) {
        containsTarget = true;
        break;
      }
    }

    if (containsTarget) {
      std::vector<cmInstallExportGenerator const*> const* installs =
        exportSet->GetInstallations();
      for (cmInstallExportGenerator const* install : *installs) {
        namespaces.push_back(install->GetNamespace());
      }
    }
  }

  return namespaces;
}